

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O2

void __thiscall icu_63::MeasureUnit::initTime(MeasureUnit *this,char *timeId)

{
  int start;
  int32_t iVar1;
  
  iVar1 = binarySearch((char **)gTypes,0,0x14,"duration");
  this->fTypeId = iVar1;
  start = (&gOffsets)[iVar1];
  iVar1 = binarySearch((char **)gSubTypes,start,(&DAT_003819f4)[iVar1],timeId);
  this->fSubTypeId = iVar1 - start;
  return;
}

Assistant:

void MeasureUnit::initTime(const char *timeId) {
    int32_t result = binarySearch(gTypes, 0, UPRV_LENGTHOF(gTypes), "duration");
    U_ASSERT(result != -1);
    fTypeId = result;
    result = binarySearch(gSubTypes, gOffsets[fTypeId], gOffsets[fTypeId + 1], timeId);
    U_ASSERT(result != -1);
    fSubTypeId = result - gOffsets[fTypeId]; 
}